

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  char *extraout_RDX;
  void *in_RSI;
  CheckOpMessageBuilder aCStack_1a8 [112];
  ios_base aiStack_138 [264];
  char local_10 [16];
  
  pcVar1 = (char *)(this->elements_int & 0xfffffffffffffff8);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  pcVar1 = local_10;
  elements();
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
            (aCStack_1a8,extraout_RDX);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)&absl::lts_20240722::log_internal::kCharNull;
  }
  sVar2 = strlen(pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aCStack_1a8,pcVar1,sVar2);
  poVar3 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar3,in_RSI);
  pcVar1 = (char *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aCStack_1a8);
  std::ios_base::~ios_base(aiStack_138);
  return pcVar1;
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }